

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionFuncs.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::ItoRFunction::ItoRFunction(ItoRFunction *this)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,Itor,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_00b7c6a0;
  return;
}

Assistant:

ItoRFunction() : SystemSubroutine(KnownSystemName::Itor, SubroutineKind::Function) {}